

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::hex_floating(spec *s)

{
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  initializer_list<unsigned_char> cs_01;
  initializer_list<unsigned_char> cs_02;
  sequence *in_RDI;
  undefined8 in_stack_fffffffffffffcf8;
  undefined2 uVar1;
  character_in_range *in_stack_fffffffffffffd00;
  hexdig *this;
  character_either *in_stack_fffffffffffffd08;
  hexdig *in_stack_fffffffffffffd10;
  character_in_range *s_00;
  sequence *in_stack_fffffffffffffd18;
  undefined1 *length;
  character_either *in_stack_fffffffffffffd20;
  character_either *this_00;
  repeat_at_least *in_stack_fffffffffffffd28;
  character_either *args_4;
  size_type in_stack_fffffffffffffd30;
  sequence *this_01;
  character_either *args_2;
  sequence *args;
  sequence *this_02;
  scanner_base in_stack_fffffffffffffd58;
  hexdig *in_stack_fffffffffffffd60;
  scanner_base in_stack_fffffffffffffd68;
  undefined1 local_27a [10];
  undefined8 local_270;
  undefined1 local_268 [54];
  undefined1 local_232;
  undefined1 local_231;
  undefined1 *local_230;
  undefined8 local_228;
  character_either local_200;
  character_either local_1e0 [3];
  sequence local_180 [2];
  character_either local_130 [4];
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 *local_50;
  undefined8 local_48;
  sequence local_40 [2];
  
  uVar1 = (undefined2)((ulong)in_stack_fffffffffffffcf8 >> 0x30);
  local_52 = 0x2b;
  local_51 = 0x2d;
  local_50 = &local_52;
  local_48 = 2;
  this_02 = local_40;
  cs._M_len = in_stack_fffffffffffffd30;
  cs._M_array = (iterator)in_stack_fffffffffffffd28;
  args = in_RDI;
  character_either::character_either(in_stack_fffffffffffffd20,cs);
  maybe::maybe<toml::detail::character_either>
            ((maybe *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  character::character((character *)in_stack_fffffffffffffd00,(char_type)((ushort)uVar1 >> 8));
  local_aa = 0x78;
  local_a9 = 0x58;
  local_a8 = &local_aa;
  local_a0 = 2;
  cs_00._M_len = in_stack_fffffffffffffd30;
  cs_00._M_array = (iterator)in_stack_fffffffffffffd28;
  character_either::character_either(in_stack_fffffffffffffd20,cs_00);
  args_2 = local_130;
  hexdig::hexdig(in_stack_fffffffffffffd60,(spec *)in_stack_fffffffffffffd58._vptr_scanner_base);
  repeat_at_least::repeat_at_least<toml::detail::syntax::hexdig>
            ((repeat_at_least *)in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd10);
  character::character((character *)in_stack_fffffffffffffd00,(char_type)((ushort)uVar1 >> 8));
  this_01 = local_180;
  hexdig::hexdig(in_stack_fffffffffffffd60,(spec *)in_stack_fffffffffffffd58._vptr_scanner_base);
  repeat_at_least::repeat_at_least<toml::detail::syntax::hexdig>
            ((repeat_at_least *)in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd10);
  sequence::
  sequence<toml::detail::repeat_at_least,toml::detail::character,toml::detail::repeat_at_least>
            (this_01,in_stack_fffffffffffffd28,(character *)in_stack_fffffffffffffd20,
             (repeat_at_least *)in_stack_fffffffffffffd18);
  args_4 = local_1e0;
  hexdig::hexdig(in_stack_fffffffffffffd60,(spec *)in_stack_fffffffffffffd58._vptr_scanner_base);
  repeat_at_least::repeat_at_least<toml::detail::syntax::hexdig>
            ((repeat_at_least *)in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd10);
  this_00 = &local_200;
  character::character((character *)in_stack_fffffffffffffd00,(char_type)((ushort)uVar1 >> 8));
  maybe::maybe<toml::detail::character>
            ((maybe *)in_stack_fffffffffffffd10,(character *)in_stack_fffffffffffffd08);
  sequence::sequence<toml::detail::repeat_at_least,toml::detail::maybe>
            ((sequence *)this_00,(repeat_at_least *)in_stack_fffffffffffffd18,
             (maybe *)in_stack_fffffffffffffd10);
  either::either<toml::detail::sequence,toml::detail::sequence>
            ((either *)this_00,in_stack_fffffffffffffd18,(sequence *)in_stack_fffffffffffffd10);
  local_232 = 0x70;
  local_231 = 0x50;
  local_230 = &local_232;
  local_228 = 2;
  cs_01._M_len = (size_type)this_01;
  cs_01._M_array = (iterator)args_4;
  character_either::character_either(this_00,cs_01);
  local_27a[0] = 0x2b;
  local_27a[1] = 0x2d;
  local_27a._2_8_ = local_27a;
  local_270 = 2;
  length = local_268;
  cs_02._M_len = (size_type)this_01;
  cs_02._M_array = (iterator)args_4;
  character_either::character_either(this_00,cs_02);
  maybe::maybe<toml::detail::character_either>
            ((maybe *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  s_00 = (character_in_range *)&stack0xfffffffffffffd58;
  character_in_range::character_in_range
            (in_stack_fffffffffffffd00,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  repeat_at_least::repeat_at_least<toml::detail::character_in_range>
            ((repeat_at_least *)this_00,(size_t)length,s_00);
  this = (hexdig *)&stack0xfffffffffffffd68;
  sequence::
  sequence<toml::detail::maybe,toml::detail::character,toml::detail::character_either,toml::detail::either,toml::detail::character_either,toml::detail::maybe,toml::detail::repeat_at_least>
            (this_02,(maybe *)args,(character *)in_RDI,args_2,(either *)this_01,args_4,
             (maybe *)in_stack_fffffffffffffd60,
             (repeat_at_least *)in_stack_fffffffffffffd68._vptr_scanner_base);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  character_in_range::~character_in_range((character_in_range *)0x73dea4);
  maybe::~maybe((maybe *)this);
  character_either::~character_either((character_either *)this);
  character_either::~character_either((character_either *)this);
  either::~either((either *)this);
  sequence::~sequence((sequence *)this);
  maybe::~maybe((maybe *)this);
  character::~character((character *)0x73deff);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  hexdig::~hexdig(this);
  sequence::~sequence((sequence *)this);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  hexdig::~hexdig(this);
  character::~character((character *)0x73df4d);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  hexdig::~hexdig(this);
  character_either::~character_either((character_either *)this);
  character::~character((character *)0x73df81);
  maybe::~maybe((maybe *)this);
  character_either::~character_either((character_either *)this);
  return args;
}

Assistant:

TOML11_INLINE sequence hex_floating(const spec& s)
{
    // C99 hexfloat (%a)
    // [+-]? 0x ( [0-9a-fA-F]*\.[0-9a-fA-F]+ | [0-9a-fA-F]+\.? ) [pP] [+-]? [0-9]+

    // - 0x(int).(frac)p[+-](int)
    // - 0x(int).p[+-](int)
    // - 0x.(frac)p[+-](int)
    // - 0x(int)p[+-](int)

    return sequence(
            maybe(character_either{char_type('+'), char_type('-')}),
            character('0'),
            character_either{char_type('x'), char_type('X')},
            either(
                sequence(
                    repeat_at_least(0, hexdig(s)),
                    character('.'),
                    repeat_at_least(1, hexdig(s))
                ),
                sequence(
                    repeat_at_least(1, hexdig(s)),
                    maybe(character('.'))
                )
            ),
            character_either{char_type('p'), char_type('P')},
            maybe(character_either{char_type('+'), char_type('-')}),
            repeat_at_least(1, character_in_range('0', '9'))
        );
}